

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiPartSharedAttributes.cpp
# Opt level: O0

void anon_unknown.dwarf_188870::testMultiPartOutputFileForExpectedFailure
               (vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *headers,string *fn,
               string *failMessage)

{
  int iVar1;
  char *pcVar2;
  Header *pHVar3;
  size_type sVar4;
  ostream *poVar5;
  string *in_RDX;
  vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *in_RDI;
  ArgExc *e;
  MultiPartOutputFile file;
  bool caught;
  MultiPartOutputFile local_30 [23];
  undefined1 local_19;
  string *local_18;
  vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *local_8;
  
  local_19 = 0;
  local_18 = in_RDX;
  local_8 = in_RDI;
  pcVar2 = (char *)std::__cxx11::string::c_str();
  remove(pcVar2);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  pHVar3 = std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::data
                     ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)0x1c7663);
  sVar4 = std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::size(local_8);
  iVar1 = Imf_3_4::globalThreadCount();
  Imf_3_4::MultiPartOutputFile::MultiPartOutputFile(local_30,pcVar2,pHVar3,(int)sVar4,false,iVar1);
  poVar5 = std::operator<<((ostream *)&std::cerr,"ERROR -- ");
  poVar5 = std::operator<<(poVar5,local_18);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartSharedAttributes.cpp"
                ,0x7e,
                "void (anonymous namespace)::testMultiPartOutputFileForExpectedFailure(const vector<Header> &, const std::string &, const string &)"
               );
}

Assistant:

void
testMultiPartOutputFileForExpectedFailure (
    const vector<Header>& headers,
    const std::string&    fn,
    const string&         failMessage = "")
{
    bool caught = false;

    try
    {
        remove (fn.c_str ());
        MultiPartOutputFile file (
            fn.c_str (), headers.data (), headers.size ());
        cerr << "ERROR -- " << failMessage << endl;
        assert (false);
    }
    catch (const IEX_NAMESPACE::ArgExc& e)
    {
        // expected behaviour
        caught = true;
    }
    assert (caught);
}